

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatastream.h
# Opt level: O3

QDataStream *
QtPrivate::writeSequentialContainer<QList<TCBPoint>>(QDataStream *s,QList<TCBPoint> *c)

{
  ulong i;
  QDataStream *this;
  qint32 i_00;
  value_type *t;
  TCBPoint *point;
  long lVar1;
  
  i = (c->d).size;
  if (i >> 1 < 0x7fffffff) {
    i_00 = (qint32)i;
  }
  else {
    if (0x15 < s->ver) {
      this = QDataStream::operator<<(s,-2);
      QDataStream::operator<<(this,i);
      goto LAB_003e6db5;
    }
    if (i != 0xfffffffe) {
      QDataStream::setStatus(s,SizeLimitExceeded);
      return s;
    }
    i_00 = -2;
  }
  QDataStream::operator<<(s,i_00);
LAB_003e6db5:
  lVar1 = (c->d).size;
  if (lVar1 != 0) {
    point = (c->d).ptr;
    lVar1 = lVar1 * 0x28;
    do {
      ::operator<<(s,point);
      point = point + 1;
      lVar1 = lVar1 + -0x28;
    } while (lVar1 != 0);
  }
  return s;
}

Assistant:

QDataStream &writeSequentialContainer(QDataStream &s, const Container &c)
{
    if (!QDataStream::writeQSizeType(s, c.size()))
        return s;
    for (const typename Container::value_type &t : c)
        s << t;

    return s;
}